

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

bool __thiscall gimage::ImageIO::handlesFile(ImageIO *this,char *name,bool reading)

{
  getBasicImageIO(this,name,reading);
  return true;
}

Assistant:

bool ImageIO::handlesFile(const char *name, bool reading) const
{
  bool ret;

  try
  {
    getBasicImageIO(name, reading);
    ret=true;
  }
  catch (const std::exception &)
  {
    ret=false;
  }

  return ret;
}